

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase106::run(TestCase106 *this)

{
  Schema SVar1;
  WirePointer id;
  uint64_t id_00;
  WirePointer id_01;
  bool bVar2;
  Reader RVar3;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StructSchema union1g;
  StructSchema schema;
  Field u1f0s8;
  Field union1;
  Schema local_f8;
  Schema local_f0;
  ArrayPtr<const_char> local_e8;
  WirePointer *local_d8;
  int local_d0;
  uint local_c8;
  Field local_98;
  Field local_58;
  
  local_e8.size_ = (size_t)local_e8.ptr;
  local_e8.ptr = "p5a";
  local_f0.raw = (RawBrandedSchema *)Schema::asStruct((Schema *)&local_e8);
  name.content.size_ = 5;
  name.content.ptr = "bit0";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e8,(StructSchema *)&local_f0,name);
  if (((char)local_e8.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[59]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x6d,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"bit0\\\") != nullptr\"",
               (char (*) [59])"failed: expected schema.findFieldByName(\"bit0\") != nullptr");
  }
  name_00.content.size_ = 7;
  name_00.content.ptr = "u1f0s8";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e8,(StructSchema *)&local_f0,name_00);
  if (((char)local_e8.ptr == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x6e,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"u1f0s8\\\") == nullptr\"",
               (char (*) [61])"failed: expected schema.findFieldByName(\"u1f0s8\") == nullptr");
  }
  name_01.content.size_ = 7;
  name_01.content.ptr = "union1";
  StructSchema::getFieldByName(&local_58,(StructSchema *)&local_f0,name_01);
  if (local_58.proto._reader.dataSize < 0xc0) {
    id_00 = 0;
  }
  else {
    id_00 = *(uint64_t *)((long)local_58.proto._reader.data + 0x10);
  }
  id.offsetAndKind.value = 0;
  id.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  SVar1 = Schema::getDependency(&local_f0,id_00,0);
  local_e8.ptr = (char *)SVar1.raw;
  local_f8.raw = (RawBrandedSchema *)Schema::asStruct((Schema *)&local_e8);
  Schema::getProto((Reader *)&local_e8,&local_f8);
  if (0xbf < local_c8) {
    id = local_d8[2];
  }
  SVar1 = Schema::getDependency(&local_f8,(uint64_t)id,0);
  if ((local_f0.raw != SVar1.raw) && (kj::_::Debug::minSeverity < 3)) {
    Schema::getProto((Reader *)&local_e8,&local_f8);
    if (local_c8 < 0xc0) {
      id_01.offsetAndKind.value = 0;
      id_01.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      id_01 = local_d8[2];
    }
    local_98.parent.super_Schema = Schema::getDependency(&local_f8,(uint64_t)id_01,0);
    kj::_::Debug::log<char_const(&)[86],capnp::StructSchema&,capnp::Schema>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x72,ERROR,
               "\"failed: expected \" \"(schema) == (union1g.getDependency(union1g.getProto().getScopeId()))\", schema, union1g.getDependency(union1g.getProto().getScopeId())"
               ,(char (*) [86])
                "failed: expected (schema) == (union1g.getDependency(union1g.getProto().getScopeId()))"
               ,(StructSchema *)&local_f0,(Schema *)&local_98);
  }
  name_02.content.size_ = 5;
  name_02.content.ptr = "bin0";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e8,(StructSchema *)&local_f8,name_02);
  if (((char)local_e8.ptr == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x73,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"bin0\\\") == nullptr\"",
               (char (*) [60])"failed: expected union1g.findFieldByName(\"bin0\") == nullptr");
  }
  name_03.content.size_ = 7;
  name_03.content.ptr = "u1f0s8";
  StructSchema::getFieldByName(&local_98,(StructSchema *)&local_f8,name_03);
  bVar2 = local_98.proto._reader.pointerCount == 0;
  local_d8 = local_98.proto._reader.pointers;
  if (bVar2) {
    local_d8 = (WirePointer *)0x0;
  }
  local_d0 = 0x7fffffff;
  if (!bVar2) {
    local_d0 = local_98.proto._reader.nestingLimit;
  }
  local_e8.ptr._0_4_ = 0;
  local_e8.ptr._4_4_ = 0;
  local_e8.size_._0_4_ = 0;
  local_e8.size_._4_4_ = 0;
  if (!bVar2) {
    local_e8.ptr._0_4_ = local_98.proto._reader.segment._0_4_;
    local_e8.ptr._4_4_ = local_98.proto._reader.segment._4_4_;
    local_e8.size_._0_4_ = local_98.proto._reader.capTable._0_4_;
    local_e8.size_._4_4_ = local_98.proto._reader.capTable._4_4_;
  }
  RVar3 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_e8,(void *)0x0,0);
  if (RVar3.super_StringPtr.content.size_ == 7) {
    if (((short)RVar3.super_StringPtr.content.ptr[1] != 0x3873 ||
        *RVar3.super_StringPtr.content.ptr != 0x30663175) && kj::_::Debug::minSeverity < 3)
    goto LAB_002afc77;
  }
  else {
    if (2 < kj::_::Debug::minSeverity) goto LAB_002afd31;
LAB_002afc77:
    bVar2 = local_98.proto._reader.pointerCount == 0;
    local_d8 = local_98.proto._reader.pointers;
    if (bVar2) {
      local_d8 = (WirePointer *)0x0;
    }
    local_d0 = 0x7fffffff;
    if (!bVar2) {
      local_d0 = local_98.proto._reader.nestingLimit;
    }
    local_e8.ptr._0_4_ = 0;
    local_e8.ptr._4_4_ = 0;
    local_e8.size_._0_4_ = 0;
    local_e8.size_._4_4_ = 0;
    if (!bVar2) {
      local_e8.ptr._0_4_ = local_98.proto._reader.segment._0_4_;
      local_e8.ptr._4_4_ = local_98.proto._reader.segment._4_4_;
      local_e8.size_._0_4_ = local_98.proto._reader.capTable._0_4_;
      local_e8.size_._4_4_ = local_98.proto._reader.capTable._4_4_;
    }
    local_e8 = (ArrayPtr<const_char>)
               PointerReader::getBlob<capnp::Text>((PointerReader *)&local_e8,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[61],char_const(&)[7],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x76,ERROR,
               "\"failed: expected \" \"(\\\"u1f0s8\\\") == (u1f0s8.getProto().getName())\", \"u1f0s8\", u1f0s8.getProto().getName()"
               ,(char (*) [61])"failed: expected (\"u1f0s8\") == (u1f0s8.getProto().getName())",
               (char (*) [7])"u1f0s8",(Reader *)&local_e8);
  }
  if ((local_98.parent.super_Schema.raw != (Schema)local_f8.raw) && (kj::_::Debug::minSeverity < 3))
  {
    kj::_::Debug::log<char_const(&)[57]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x77,ERROR,"\"failed: expected \" \"u1f0s8.getContainingStruct() == union1g\"",
               (char (*) [57])"failed: expected u1f0s8.getContainingStruct() == union1g");
  }
LAB_002afd31:
  name_04.content.size_ = 7;
  name_04.content.ptr = "u1f1s8";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e8,(StructSchema *)&local_f8,name_04);
  if (((char)local_e8.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x79,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f1s8\\\") != nullptr\"",
               (char (*) [62])"failed: expected union1g.findFieldByName(\"u1f1s8\") != nullptr");
  }
  name_05.content.size_ = 8;
  name_05.content.ptr = "u1f0s32";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e8,(StructSchema *)&local_f8,name_05);
  if (((char)local_e8.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[63]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7a,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f0s32\\\") != nullptr\"",
               (char (*) [63])"failed: expected union1g.findFieldByName(\"u1f0s32\") != nullptr");
  }
  name_06.content.size_ = 7;
  name_06.content.ptr = "u1f0sp";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e8,(StructSchema *)&local_f8,name_06);
  if (((char)local_e8.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7b,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f0sp\\\") != nullptr\"",
               (char (*) [62])"failed: expected union1g.findFieldByName(\"u1f0sp\") != nullptr");
  }
  name_07.content.size_ = 7;
  name_07.content.ptr = "u1f1s1";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e8,(StructSchema *)&local_f8,name_07);
  if (((char)local_e8.ptr == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7c,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u1f1s1\\\") != nullptr\"",
               (char (*) [62])"failed: expected union1g.findFieldByName(\"u1f1s1\") != nullptr");
  }
  name_08.content.size_ = 7;
  name_08.content.ptr = "u0f0s1";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e8,(StructSchema *)&local_f8,name_08);
  if (((char)local_e8.ptr == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7e,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u0f0s1\\\") == nullptr\"",
               (char (*) [62])"failed: expected union1g.findFieldByName(\"u0f0s1\") == nullptr");
  }
  name_09.content.size_ = 7;
  name_09.content.ptr = "u2f0s8";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e8,(StructSchema *)&local_f8,name_09);
  if (((char)local_e8.ptr == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[62]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x7f,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"u2f0s8\\\") == nullptr\"",
               (char (*) [62])"failed: expected union1g.findFieldByName(\"u2f0s8\") == nullptr");
  }
  name_10.content.size_ = 0xc;
  name_10.content.ptr = "noSuchField";
  StructSchema::findFieldByName
            ((Maybe<capnp::StructSchema::Field> *)&local_e8,(StructSchema *)&local_f8,name_10);
  if (((char)local_e8.ptr == '\x01') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[67]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-test.c++"
               ,0x80,ERROR,
               "\"failed: expected \" \"union1g.findFieldByName(\\\"noSuchField\\\") == nullptr\"",
               (char (*) [67])"failed: expected union1g.findFieldByName(\"noSuchField\") == nullptr"
              );
  }
  return;
}

Assistant:

TEST(Schema, Unions) {
  auto schema = Schema::from<TestUnion>().asStruct();

  EXPECT_TRUE(schema.findFieldByName("bit0") != nullptr);
  EXPECT_TRUE(schema.findFieldByName("u1f0s8") == nullptr);

  auto union1 = schema.getFieldByName("union1");
  auto union1g = schema.getDependency(union1.getProto().getGroup().getTypeId()).asStruct();
  EXPECT_EQ(schema, union1g.getDependency(union1g.getProto().getScopeId()));
  EXPECT_TRUE(union1g.findFieldByName("bin0") == nullptr);

  auto u1f0s8 = union1g.getFieldByName("u1f0s8");
  EXPECT_EQ("u1f0s8", u1f0s8.getProto().getName());
  EXPECT_TRUE(u1f0s8.getContainingStruct() == union1g);

  EXPECT_TRUE(union1g.findFieldByName("u1f1s8") != nullptr);
  EXPECT_TRUE(union1g.findFieldByName("u1f0s32") != nullptr);
  EXPECT_TRUE(union1g.findFieldByName("u1f0sp") != nullptr);
  EXPECT_TRUE(union1g.findFieldByName("u1f1s1") != nullptr);

  EXPECT_TRUE(union1g.findFieldByName("u0f0s1") == nullptr);
  EXPECT_TRUE(union1g.findFieldByName("u2f0s8") == nullptr);
  EXPECT_TRUE(union1g.findFieldByName("noSuchField") == nullptr);
}